

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImFont::ImFont(ImFont *this)

{
  (this->IndexLookup).Data = (ImWchar *)0x0;
  (this->Glyphs).Size = L'\0';
  (this->Glyphs).Capacity = L'\0';
  this->FallbackAdvanceX = 0.0;
  this->FontSize = 0.0;
  (this->IndexLookup).Size = L'\0';
  (this->IndexLookup).Capacity = L'\0';
  (this->Glyphs).Data = (ImFontGlyph *)0x0;
  (this->IndexAdvanceX).Size = L'\0';
  (this->IndexAdvanceX).Capacity = L'\0';
  (this->IndexAdvanceX).Data = (float *)0x0;
  this->FallbackChar = 0xffff;
  this->EllipsisChar = 0xffff;
  this->DotChar = 0xffff;
  this->DirtyLookupTables = false;
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas_conflict *)0x0;
  *(undefined8 *)((long)&this->ContainerAtlas + 2) = 0;
  *(undefined8 *)((long)&this->ConfigData + 2) = 0;
  this->Scale = 1.0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  *(undefined8 *)((long)&this->Descent + 2) = 0;
  return;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }